

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cShaderImageLoadStoreTests.cpp
# Opt level: O1

long __thiscall glcts::anon_unknown_0::BasicGLSLEarlyFragTests::Setup(BasicGLSLEarlyFragTests *this)

{
  this->m_vao = 0;
  this->m_vbo = 0;
  this->c_program = 0;
  this->m_buffer = 0;
  this->m_texture[0] = 0;
  this->m_texture[1] = 0;
  this->m_program[0] = 0;
  this->m_program[1] = 0;
  return 0;
}

Assistant:

virtual long Setup()
	{
		m_texture[0] = m_texture[1] = 0;
		m_program[0] = m_program[1] = 0;
		m_vao = m_vbo = 0;
		m_buffer	  = 0;
		c_program	 = 0;
		return NO_ERROR;
	}